

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.h
# Opt level: O2

void __thiscall haVoc::Moveorder::~Moveorder(Moveorder *this)

{
  this->_vptr_Moveorder = (_func_int **)&PTR_next_phase_0013f990;
  std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
            (&(this->_killerMoves).super__Vector_base<Move,_std::allocator<Move>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_movegen).super___shared_ptr<Movegen,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_quiets).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_captures).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual ~Moveorder() { }